

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O0

int __thiscall TURBOLINECOUNT::CLineCount::close(CLineCount *this,int __fd)

{
  uint __errnum;
  int iVar1;
  ulong uVar2;
  uint *puVar3;
  char *__s;
  undefined4 in_register_00000034;
  EVP_PKEY_CTX *ctx;
  allocator<char> local_79;
  tlc_string_t local_78;
  uint local_54;
  undefined1 local_4d;
  int __err;
  bool ok;
  allocator<char> local_39;
  tlc_string_t local_38;
  CLineCount *local_18;
  CLineCount *this_local;
  
  ctx = (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,__fd);
  local_18 = this;
  if ((this->m_opened & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"file not opened",&local_39);
    setLastError(this,9,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    uVar2 = std::allocator<char>::~allocator(&local_39);
    this_local._7_1_ = 0;
  }
  else {
    local_4d = 1;
    iVar1 = ::close(this->m_fh);
    if (iVar1 == -1) {
      puVar3 = (uint *)__errno_location();
      __errnum = *puVar3;
      local_54 = __errnum;
      __s = strerror(__errnum);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_79);
      ctx = (EVP_PKEY_CTX *)(ulong)__errnum;
      setLastError(this,__errnum,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      local_4d = 0;
    }
    iVar1 = init(this,ctx);
    uVar2 = (ulong)CONCAT31((int3)((uint)iVar1 >> 8),local_4d) & 0xffffffffffffff01;
    this_local._7_1_ = (undefined1)uVar2;
  }
  return (int)CONCAT71((int7)(uVar2 >> 8),this_local._7_1_);
}

Assistant:

bool CLineCount::close()
{
	if (!m_opened)
	{
		setLastError(EBADF, _T("file not opened"));
		return false;
	}

	bool ok = true;
	if (!LCCLOSEFILE(m_fh))
	{
		LCSETREALLASTERROR(EBADF, _T("unable to close file"));
		ok = false;
	}

	init();

	return ok;
}